

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

void do_movz_zpz(DisasContext_conflict1 *s,int rd,int rn,int pg,int esz)

{
  tcg_gen_gvec_3_ool_aarch64
            (s->uc->tcg_ctx,rd * 0x100 + 0xc10,rn * 0x100 + 0xc10,pg * 0x20 + 0x2c10,s->sve_len,
             s->sve_len,0,(gen_helper_gvec_3_conflict1 *)do_movz_zpz::fns[esz]);
  return;
}

Assistant:

static void do_movz_zpz(DisasContext *s, int rd, int rn, int pg, int esz)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    static gen_helper_gvec_3 * const fns[4] = {
        gen_helper_sve_movz_b, gen_helper_sve_movz_h,
        gen_helper_sve_movz_s, gen_helper_sve_movz_d,
    };
    unsigned vsz = vec_full_reg_size(s);
    tcg_gen_gvec_3_ool(tcg_ctx, vec_full_reg_offset(s, rd),
                       vec_full_reg_offset(s, rn),
                       pred_full_reg_offset(s, pg),
                       vsz, vsz, 0, fns[esz]);
}